

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O2

ACT_TYPE __thiscall
despot::AdventurerSmartPolicy::Action
          (AdventurerSmartPolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  int iVar1;
  pointer ppSVar2;
  byte bVar3;
  int i;
  long lVar4;
  
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  bVar3 = 1;
  for (lVar4 = 0;
      (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3 != lVar4;
      lVar4 = lVar4 + 1) {
    iVar1 = this->regdemo_model_->size_;
    bVar3 = bVar3 & *(int *)(ppSVar2[lVar4] + 0xc) % iVar1 == iVar1 + -1;
  }
  return ((byte)~bVar3 & 1) * 2;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		bool at_goal = true;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			if (static_cast<AdventurerState*>(particle)->state_id
				% regdemo_model_->size_ != regdemo_model_->size_ - 1) {
				at_goal = false;
			}
		}

		if (at_goal) {
			return regdemo_model_->A_STAY;
		}
		return regdemo_model_->A_RIGHT;
	}